

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

void __thiscall
google::protobuf::SimpleDescriptorDatabase::~SimpleDescriptorDatabase
          (SimpleDescriptorDatabase *this)

{
  (this->super_DescriptorDatabase)._vptr_DescriptorDatabase =
       (_func_int **)&PTR__SimpleDescriptorDatabase_002989a0;
  STLDeleteElements<std::vector<google::protobuf::FileDescriptorProto_const*,std::allocator<google::protobuf::FileDescriptorProto_const*>>>
            (&this->files_to_delete_);
  std::
  _Vector_base<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>
  ::~_Vector_base(&(this->files_to_delete_).
                   super__Vector_base<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>
                 );
  DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::~DescriptorIndex(&this->index_);
  return;
}

Assistant:

SimpleDescriptorDatabase::~SimpleDescriptorDatabase() {
  STLDeleteElements(&files_to_delete_);
}